

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
::LookupBucketFor<llbuild::core::CancellationDelegate*>
          (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
           *this,CancellationDelegate **Val,
          DenseSetPair<llbuild::core::CancellationDelegate_*> **FoundBucket)

{
  CancellationDelegate *pCVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar8;
  int iVar9;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar10;
  
  if (*(int *)(this + 0x10) == 0) {
    *FoundBucket = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
    bVar4 = 0;
  }
  else {
    pCVar1 = *Val;
    if (((ulong)pCVar1 | 8) == 0xfffffffffffffff8) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, BucketT = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, LookupKeyT = llbuild::core::CancellationDelegate *]"
                   );
    }
    lVar2 = *(long *)this;
    uVar5 = (ulong)pCVar1 >> 4 & 0xfffffff;
    uVar6 = *(int *)(this + 0x10) - 1;
    uVar7 = ((uint)pCVar1 >> 9 ^ (uint)uVar5) & uVar6;
    iVar9 = 1;
    pDVar8 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
    do {
      pDVar10 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)(lVar2 + (ulong)uVar7 * 8);
      pCVar1 = pDVar10->key;
      if (*Val == pCVar1) {
        *FoundBucket = pDVar10;
        uVar5 = 1;
        bVar3 = false;
      }
      else if (pCVar1 == (CancellationDelegate *)0xfffffffffffffff8) {
        if (pDVar8 != (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
          pDVar10 = pDVar8;
        }
        *FoundBucket = pDVar10;
        bVar3 = false;
        uVar5 = 0;
      }
      else {
        if (pCVar1 == (CancellationDelegate *)0xfffffffffffffff0 &&
            pDVar8 == (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
          pDVar8 = pDVar10;
        }
        uVar7 = uVar7 + iVar9;
        iVar9 = iVar9 + 1;
        uVar7 = uVar7 & uVar6;
        bVar3 = true;
      }
      bVar4 = (byte)uVar5;
    } while (bVar3);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }